

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O1

int BZ2_bzCompress(bz_stream *strm,int action)

{
  long *plVar1;
  bz_stream *pbVar2;
  Bool BVar3;
  int iVar4;
  
  if (strm == (bz_stream *)0x0) {
    return -2;
  }
  plVar1 = (long *)strm->state;
  if (plVar1 == (long *)0x0) {
    return -2;
  }
  pbVar2 = (bz_stream *)*plVar1;
  if (pbVar2 != strm) {
    return -2;
  }
  iVar4 = (int)plVar1[1];
  while (iVar4 == 2) {
    if (action == 1) {
      iVar4 = 3;
    }
    else {
      iVar4 = 4;
      if (action != 2) {
        if (action != 0) {
          return -2;
        }
        BVar3 = handle_compress(strm);
        return (uint)(BVar3 != '\0') * 3 + -2;
      }
    }
    *(uint *)(plVar1 + 2) = strm->avail_in;
    *(int *)(plVar1 + 1) = iVar4;
  }
  if (iVar4 != 1) {
    if (iVar4 == 3) {
      if (action == 1) {
        if (*(uint *)(plVar1 + 2) != pbVar2->avail_in) {
          return -1;
        }
        handle_compress(strm);
        if ((int)plVar1[2] != 0) {
          return 2;
        }
        if ((*(uint *)((long)plVar1 + 0x5c) < 0x100) && (0 < (int)plVar1[0xc])) {
          return 2;
        }
        if ((int)plVar1[0xf] < *(int *)((long)plVar1 + 0x74)) {
          return 2;
        }
        *(undefined4 *)(plVar1 + 1) = 2;
        return 1;
      }
    }
    else {
      if (iVar4 != 4) {
        return 0;
      }
      if ((action == 2) && (*(uint *)(plVar1 + 2) == pbVar2->avail_in)) {
        BVar3 = handle_compress(strm);
        if (BVar3 == '\0') {
          return -1;
        }
        if ((int)plVar1[2] != 0) {
          return 3;
        }
        if ((*(uint *)((long)plVar1 + 0x5c) < 0x100) && (0 < (int)plVar1[0xc])) {
          return 3;
        }
        if ((int)plVar1[0xf] < *(int *)((long)plVar1 + 0x74)) {
          return 3;
        }
        *(undefined4 *)(plVar1 + 1) = 1;
        return 4;
      }
    }
  }
  return -1;
}

Assistant:

int BZ_API(BZ2_bzCompress) ( bz_stream *strm, int action )
{
   Bool progress;
   EState* s;
   if (strm == NULL) return BZ_PARAM_ERROR;
   s = (EState *)strm->state;
   if (s == NULL) return BZ_PARAM_ERROR;
   if (s->strm != strm) return BZ_PARAM_ERROR;

   preswitch:
   switch (s->mode) {

      case BZ_M_IDLE:
         return BZ_SEQUENCE_ERROR;

      case BZ_M_RUNNING:
         if (action == BZ_RUN) {
            progress = handle_compress ( strm );
            return progress ? BZ_RUN_OK : BZ_PARAM_ERROR;
         } 
         else
     if (action == BZ_FLUSH) {
            s->avail_in_expect = strm->avail_in;
            s->mode = BZ_M_FLUSHING;
            goto preswitch;
         }
         else
         if (action == BZ_FINISH) {
            s->avail_in_expect = strm->avail_in;
            s->mode = BZ_M_FINISHING;
            goto preswitch;
         }
         else 
            return BZ_PARAM_ERROR;

      case BZ_M_FLUSHING:
         if (action != BZ_FLUSH) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect != s->strm->avail_in) 
            return BZ_SEQUENCE_ERROR;
         progress = handle_compress ( strm );
         if (s->avail_in_expect > 0 || !isempty_RL(s) ||
             s->state_out_pos < s->numZ) return BZ_FLUSH_OK;
         s->mode = BZ_M_RUNNING;
         return BZ_RUN_OK;

      case BZ_M_FINISHING:
         if (action != BZ_FINISH) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect != s->strm->avail_in) 
            return BZ_SEQUENCE_ERROR;
         progress = handle_compress ( strm );
         if (!progress) return BZ_SEQUENCE_ERROR;
         if (s->avail_in_expect > 0 || !isempty_RL(s) ||
             s->state_out_pos < s->numZ) return BZ_FINISH_OK;
         s->mode = BZ_M_IDLE;
         return BZ_STREAM_END;
   }
   return BZ_OK; /*--not reached--*/
}